

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

string * __thiscall
helics::RerouteFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RerouteFilterOperation *this,string_view property)

{
  size_t sVar1;
  _Base_ptr p_Var2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  long *plVar5;
  handle cond;
  unique_lock<std::shared_mutex> local_38;
  
  plVar5 = (long *)property._M_str;
  if (property._M_len == 9) {
    if ((char)plVar5[1] == 'n' && *plVar5 == 0x6f697469646e6f63) {
      local_38._M_device = &(this->conditions).m_mutex;
      local_38._M_owns = false;
      std::unique_lock<std::shared_mutex>::lock(&local_38);
      local_38._M_owns = true;
      sVar1 = (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (sVar1 == 1) {
        p_Var2 = (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        lVar3 = *(long *)(p_Var2 + 1);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,lVar3,
                   (long)&(p_Var2[1]._M_parent)->_M_color + lVar3);
      }
      else if (sVar1 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
        for (p_Var4 = (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 !=
            &(this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,'\"');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,*(char **)(p_Var4 + 1),(size_type)p_Var4[1]._M_parent);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,'\"');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,',');
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (__return_storage_ptr__);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,']');
      }
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_38);
      return __return_storage_ptr__;
    }
  }
  else if ((property._M_len == 0xe) &&
          (*(long *)((long)plVar5 + 6) == 0x6e6f6974616e6974 && *plVar5 == 0x697473656477656e)) {
    gmlc::libguarded::
    atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
    ::load(__return_storage_ptr__,&this->newDest);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string RerouteFilterOperation::getString(std::string_view property)
{
    if (property == "newdestination") {
        return newDest.load();
    }
    if (property == "condition") {
        auto cond = conditions.lock();
        if (cond->empty()) {
            return {};
        }
        if (cond->size() == 1) {
            return *cond->begin();
        }
        std::string results{"["};
        for (const auto& condition : cond) {
            results.push_back('"');
            results.append(condition);
            results.push_back('"');
            results.push_back(',');
        }
        results.pop_back();
        results.push_back(']');
        return results;
    }
    return FilterOperations::getString(property);
}